

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O3

Result __thiscall
wabt::BinaryReaderLogging::OnTryTableExpr
          (BinaryReaderLogging *this,Type sig_type,CatchClauseVector *catches)

{
  pointer pCVar1;
  Enum EVar2;
  uint uVar3;
  char *pcVar4;
  Stream *pSVar5;
  CatchClause *catch_;
  pointer pCVar6;
  
  WriteIndent(this);
  Stream::Writef(this->stream_,"OnTryTableExpr(sig: ");
  LogType(this,sig_type);
  uVar3 = (int)((ulong)((long)(catches->
                              super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(catches->
                             super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
  Stream::Writef(this->stream_,", n: %u, catches: [",(ulong)uVar3);
  pCVar6 = (catches->super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (catches->super__Vector_base<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pCVar6 == pCVar1) {
      Stream::Writef(this->stream_,"])\n");
      EVar2 = (*this->reader_->_vptr_BinaryReaderDelegate[0x85])(this->reader_,sig_type,catches);
      return (Result)EVar2;
    }
    uVar3 = uVar3 - 1;
    if (CatchAllRef < pCVar6->kind) goto LAB_00161733;
    switch(pCVar6->kind) {
    case Catch:
      pSVar5 = this->stream_;
      pcVar4 = "catch %u %u";
      break;
    case CatchRef:
      pSVar5 = this->stream_;
      pcVar4 = "catch_ref %u %u";
      break;
    case CatchAll:
      pSVar5 = this->stream_;
      pcVar4 = "catch_all %u";
      goto LAB_00161716;
    case CatchAllRef:
      pSVar5 = this->stream_;
      pcVar4 = "catch_all_ref %u";
LAB_00161716:
      Stream::Writef(pSVar5,pcVar4,(ulong)pCVar6->depth);
      goto LAB_00161733;
    }
    Stream::Writef(pSVar5,pcVar4,(ulong)pCVar6->tag);
LAB_00161733:
    if (uVar3 != 0) {
      Stream::Writef(this->stream_,", ");
    }
    pCVar6 = pCVar6 + 1;
  } while( true );
}

Assistant:

Result BinaryReaderLogging::OnTryTableExpr(Type sig_type,
                                           const CatchClauseVector& catches) {
  LOGF("OnTryTableExpr(sig: ");
  LogType(sig_type);
  Index count = catches.size();
  LOGF_NOINDENT(", n: %" PRIindex ", catches: [", count);

  for (auto& catch_ : catches) {
    auto tag = catch_.tag;
    auto depth = catch_.depth;
    switch (catch_.kind) {
      case CatchKind::Catch:
        LOGF_NOINDENT("catch %" PRIindex " %" PRIindex, tag, depth);
        break;
      case CatchKind::CatchRef:
        LOGF_NOINDENT("catch_ref %" PRIindex " %" PRIindex, tag, depth);
        break;
      case CatchKind::CatchAll:
        LOGF_NOINDENT("catch_all %" PRIindex, depth);
        break;
      case CatchKind::CatchAllRef:
        LOGF_NOINDENT("catch_all_ref %" PRIindex, depth);
        break;
    }
    if (--count != 0) {
      LOGF_NOINDENT(", ");
    }
  }
  LOGF_NOINDENT("])\n");

  return reader_->OnTryTableExpr(sig_type, catches);
}